

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_wallmarks::load(xr_scene_wallmarks *this,xr_reader *r)

{
  float *pfVar1;
  uint __line;
  size_t sVar2;
  char *__assertion;
  uint16_t version;
  xr_reader *s;
  
  xr_scene_revision::load(&(this->super_xr_scene_part).m_revision,r);
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,1,&version);
  if (sVar2 == 0) {
    __assertion = "0";
    __line = 0x34;
  }
  else if (version == 3) {
    sVar2 = xr_reader::find_chunk(r,3);
    if (sVar2 != 0) {
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->m_width = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->m_height = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->m_rotate = *pfVar1;
      xr_reader::r_sz(r,&this->m_shader);
      xr_reader::r_sz(r,&this->m_texture);
      s = xr_reader::open_chunk(r,5);
      if (s == (xr_reader *)0x0) {
        s = xr_reader::open_chunk(r,4);
        if (s == (xr_reader *)0x0) {
          return;
        }
        xr_reader::
        r_chunks<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>,read_slot_0>
                  (s,&this->m_slots);
      }
      else {
        xr_reader::
        r_chunks<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>,read_slot_1>
                  (s,&this->m_slots);
      }
      xr_reader::close_chunk(r,&s);
      return;
    }
    __assertion = "0";
    __line = 0x38;
  }
  else {
    __assertion = "version == WALLMARK_VERSION";
    __line = 0x35;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_wallmarks.cxx"
                ,__line,"virtual void xray_re::xr_scene_wallmarks::load(xr_reader &)");
}

Assistant:

void xr_scene_wallmarks::load(xr_reader& r)
{
	revision().load(r);

	uint16_t version;
	if (!r.r_chunk<uint16_t>(WM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WALLMARK_VERSION);

	if (!r.find_chunk(WM_CHUNK_PARAMS))
		xr_not_expected();
	m_width = r.r_float();
	m_height = r.r_float();
	m_rotate = r.r_float();
	r.r_sz(m_shader);
	r.r_sz(m_texture);
	r.debug_find_chunk();

	xr_reader* s;
	if ((s = r.open_chunk(WM_CHUNK_WALLMARKS_1))) {
		s->r_chunks(m_slots, read_slot_1());
		r.close_chunk(s);
	} else if ((s = r.open_chunk(WM_CHUNK_WALLMARKS_0))) {
		s->r_chunks(m_slots, read_slot_0());
		r.close_chunk(s);
	}
}